

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_order.c
# Opt level: O0

longlong amd_l_order(longlong n,longlong *Ap,longlong *Ai,longlong *P,c_float *Control,c_float *Info
                    )

{
  longlong *W;
  longlong *Flag;
  size_t sVar1;
  longlong *in_RCX;
  longlong *in_RDX;
  longlong *unaff_RBX;
  longlong *in_RSI;
  longlong *in_RDI;
  c_float *in_R9;
  bool bVar2;
  undefined1 auVar3 [16];
  longlong *unaff_retaddr;
  longlong *in_stack_00000008;
  longlong in_stack_00000010;
  c_float mem;
  size_t slen;
  size_t nzaat;
  longlong ok;
  longlong *Ci;
  longlong *Cp;
  longlong *Ri;
  longlong *Rp;
  longlong status;
  longlong info;
  longlong *Pinv;
  longlong i;
  longlong nz;
  longlong *S;
  longlong *Len;
  size_t in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  bool local_cb;
  bool local_ca;
  ulong local_c0;
  double local_b8;
  ulong local_b0;
  longlong *local_98;
  longlong *local_90;
  long local_60;
  void *local_50;
  longlong *in_stack_fffffffffffffff0;
  longlong lVar4;
  
  bVar2 = in_R9 != (c_float *)0x0;
  if (bVar2) {
    for (local_60 = 0; local_60 < 0x14; local_60 = local_60 + 1) {
      in_R9[local_60] = -1.0;
    }
    in_R9[1] = (double)(long)in_RDI;
    *in_R9 = 0.0;
  }
  if ((((in_RDX == (longlong *)0x0) || (in_RSI == (longlong *)0x0)) || (in_RCX == (longlong *)0x0))
     || ((long)in_RDI < 0)) {
    if (bVar2) {
      *in_R9 = -2.0;
    }
    lVar4 = -2;
  }
  else if (in_RDI == (longlong *)0x0) {
    lVar4 = 0;
  }
  else {
    local_c0 = in_RSI[(long)in_RDI];
    if (bVar2) {
      in_R9[2] = (double)(long)local_c0;
    }
    if ((long)local_c0 < 0) {
      if (bVar2) {
        *in_R9 = -2.0;
      }
      lVar4 = -2;
    }
    else if ((in_RDI < (longlong *)0x1fffffffffffffff) && (local_c0 < 0x1fffffffffffffff)) {
      lVar4 = amd_l_valid((longlong)in_RDI,(longlong)in_RDI,in_RSI,in_RDX);
      if (lVar4 == -2) {
        if (bVar2) {
          *in_R9 = -2.0;
        }
        lVar4 = -2;
      }
      else {
        W = (longlong *)SuiteSparse_malloc(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        Flag = (longlong *)SuiteSparse_malloc(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        local_b8 = (double)(long)in_RDI + (double)(long)in_RDI + 0.0;
        if ((W == (longlong *)0x0) || (Flag == (longlong *)0x0)) {
          SuiteSparse_free((void *)0x27fb7b);
          SuiteSparse_free((void *)0x27fb88);
          if (bVar2) {
            *in_R9 = -1.0;
          }
          lVar4 = -1;
        }
        else {
          local_98 = in_RDX;
          local_90 = in_RSI;
          if (lVar4 == 1) {
            local_90 = (longlong *)
                       SuiteSparse_malloc(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            local_98 = (longlong *)
                       SuiteSparse_malloc(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            if ((long)local_c0 < 2) {
              local_c0 = 1;
            }
            local_b8 = (double)(long)local_c0 + (double)(long)((long)in_RDI + 1) + local_b8;
            if ((local_90 == (longlong *)0x0) || (local_98 == (longlong *)0x0)) {
              SuiteSparse_free((void *)0x27fc6c);
              SuiteSparse_free((void *)0x27fc76);
              SuiteSparse_free((void *)0x27fc83);
              SuiteSparse_free((void *)0x27fc90);
              if (bVar2) {
                *in_R9 = -1.0;
              }
              return -1;
            }
            amd_l_preprocess((longlong)in_RDI,in_RSI,in_RDX,local_90,local_98,W,Flag);
          }
          sVar1 = amd_l_aat((longlong)in_RDI,local_90,local_98,W,in_RCX,in_R9);
          local_50 = (void *)0x0;
          local_60 = 0;
          local_ca = sVar1 <= sVar1 + sVar1 / 5;
          local_b0 = sVar1 / 5 + sVar1;
          while (local_ca && local_60 < 7) {
            local_60 = local_60 + 1;
            local_ca = local_b0 < local_b0 + (long)in_RDI;
            local_b0 = (long)in_RDI + local_b0;
          }
          auVar3._8_4_ = (int)(local_b0 >> 0x20);
          auVar3._0_8_ = local_b0;
          auVar3._12_4_ = 0x45300000;
          local_ca = local_ca && local_b0 < 0x1fffffffffffffff;
          local_cb = local_ca && local_b0 < 0x7fffffffffffffff;
          if (local_cb) {
            local_50 = SuiteSparse_malloc(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          }
          if (local_50 == (void *)0x0) {
            SuiteSparse_free((void *)0x27ff25);
            SuiteSparse_free((void *)0x27ff2f);
            SuiteSparse_free((void *)0x27ff3c);
            SuiteSparse_free((void *)0x27ff49);
            if (bVar2) {
              *in_R9 = -1.0;
            }
            lVar4 = -1;
          }
          else {
            if (bVar2) {
              in_R9[7] = ((auVar3._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_b0) - 4503599627370496.0) +
                         local_b8) * 8.0;
            }
            amd_l1(in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,
                   in_stack_fffffffffffffff0,in_RDI,nzaat,(longlong *)ok,(c_float *)Ci,(c_float *)Cp
                  );
            SuiteSparse_free((void *)0x280008);
            SuiteSparse_free((void *)0x280012);
            SuiteSparse_free((void *)0x28001f);
            SuiteSparse_free((void *)0x28002c);
            SuiteSparse_free((void *)0x280039);
            if (bVar2) {
              *in_R9 = (double)lVar4;
            }
          }
        }
      }
    }
    else {
      if (bVar2) {
        *in_R9 = -1.0;
      }
      lVar4 = -1;
    }
  }
  return lVar4;
}

Assistant:

GLOBAL Int AMD_order
(
    Int n,
    const Int Ap [ ],
    const Int Ai [ ],
    Int P [ ],
    c_float Control [ ],
    c_float Info [ ]
)
{
    Int *Len, *S, nz, i, *Pinv, info, status, *Rp, *Ri, *Cp, *Ci, ok ;
    size_t nzaat, slen ;
    c_float mem = 0 ;

#ifndef NDEBUG
    AMD_debug_init ("amd") ;
#endif

    /* clear the Info array, if it exists */
    info = Info != (c_float *) NULL ;
    if (info)
    {
	for (i = 0 ; i < AMD_INFO ; i++)
	{
	    Info [i] = EMPTY ;
	}
	Info [AMD_N] = n ;
	Info [AMD_STATUS] = AMD_OK ;
    }

    /* make sure inputs exist and n is >= 0 */
    if (Ai == (Int *) NULL || Ap == (Int *) NULL || P == (Int *) NULL || n < 0)
    {
	if (info) Info [AMD_STATUS] = AMD_INVALID ;
	return (AMD_INVALID) ;	    /* arguments are invalid */
    }

    if (n == 0)
    {
	return (AMD_OK) ;	    /* n is 0 so there's nothing to do */
    }

    nz = Ap [n] ;
    if (info)
    {
	Info [AMD_NZ] = nz ;
    }
    if (nz < 0)
    {
	if (info) Info [AMD_STATUS] = AMD_INVALID ;
	return (AMD_INVALID) ;
    }

    /* check if n or nz will cause size_t overflow */
    if (((size_t) n) >= SIZE_T_MAX / sizeof (Int)
     || ((size_t) nz) >= SIZE_T_MAX / sizeof (Int))
    {
	if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	return (AMD_OUT_OF_MEMORY) ;	    /* problem too large */
    }

    /* check the input matrix:	AMD_OK, AMD_INVALID, or AMD_OK_BUT_JUMBLED */
    status = AMD_valid (n, n, Ap, Ai) ;

    if (status == AMD_INVALID)
    {
	if (info) Info [AMD_STATUS] = AMD_INVALID ;
	return (AMD_INVALID) ;	    /* matrix is invalid */
    }

    /* allocate two size-n integer workspaces */
    Len  = SuiteSparse_malloc (n, sizeof (Int)) ;
    Pinv = SuiteSparse_malloc (n, sizeof (Int)) ;
    mem += n ;
    mem += n ;
    if (!Len || !Pinv)
    {
	/* :: out of memory :: */
	SuiteSparse_free (Len) ;
	SuiteSparse_free (Pinv) ;
	if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	return (AMD_OUT_OF_MEMORY) ;
    }

    if (status == AMD_OK_BUT_JUMBLED)
    {
	/* sort the input matrix and remove duplicate entries */
	AMD_DEBUG1 (("Matrix is jumbled\n")) ;
	Rp = SuiteSparse_malloc (n+1, sizeof (Int)) ;
	Ri = SuiteSparse_malloc (nz,  sizeof (Int)) ;
	mem += (n+1) ;
	mem += MAX (nz,1) ;
	if (!Rp || !Ri)
	{
	    /* :: out of memory :: */
	    SuiteSparse_free (Rp) ;
	    SuiteSparse_free (Ri) ;
	    SuiteSparse_free (Len) ;
	    SuiteSparse_free (Pinv) ;
	    if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	    return (AMD_OUT_OF_MEMORY) ;
	}
	/* use Len and Pinv as workspace to create R = A' */
	AMD_preprocess (n, Ap, Ai, Rp, Ri, Len, Pinv) ;
	Cp = Rp ;
	Ci = Ri ;
    }
    else
    {
	/* order the input matrix as-is.  No need to compute R = A' first */
	Rp = NULL ;
	Ri = NULL ;
	Cp = (Int *) Ap ;
	Ci = (Int *) Ai ;
    }

    /* --------------------------------------------------------------------- */
    /* determine the symmetry and count off-diagonal nonzeros in A+A' */
    /* --------------------------------------------------------------------- */

    nzaat = AMD_aat (n, Cp, Ci, Len, P, Info) ;
    AMD_DEBUG1 (("nzaat: %g\n", (c_float) nzaat)) ;
    ASSERT ((MAX (nz-n, 0) <= nzaat) && (nzaat <= 2 * (size_t) nz)) ;

    /* --------------------------------------------------------------------- */
    /* allocate workspace for matrix, elbow room, and 6 size-n vectors */
    /* --------------------------------------------------------------------- */

    S = NULL ;
    slen = nzaat ;			/* space for matrix */
    ok = ((slen + nzaat/5) >= slen) ;	/* check for size_t overflow */
    slen += nzaat/5 ;			/* add elbow room */
    for (i = 0 ; ok && i < 7 ; i++)
    {
	ok = ((slen + n) > slen) ;	/* check for size_t overflow */
	slen += n ;			/* size-n elbow room, 6 size-n work */
    }
    mem += slen ;
    ok = ok && (slen < SIZE_T_MAX / sizeof (Int)) ; /* check for overflow */
    ok = ok && (slen < Int_MAX) ;	/* S[i] for Int i must be OK */
    if (ok)
    {
	S = SuiteSparse_malloc (slen, sizeof (Int)) ;
    }
    AMD_DEBUG1 (("slen %g\n", (c_float) slen)) ;
    if (!S)
    {
	/* :: out of memory :: (or problem too large) */
	SuiteSparse_free (Rp) ;
	SuiteSparse_free (Ri) ;
	SuiteSparse_free (Len) ;
	SuiteSparse_free (Pinv) ;
	if (info) Info [AMD_STATUS] = AMD_OUT_OF_MEMORY ;
	return (AMD_OUT_OF_MEMORY) ;
    }
    if (info)
    {
	/* memory usage, in bytes. */
	Info [AMD_MEMORY] = mem * sizeof (Int) ;
    }

    /* --------------------------------------------------------------------- */
    /* order the matrix */
    /* --------------------------------------------------------------------- */

    AMD_1 (n, Cp, Ci, P, Pinv, Len, slen, S, Control, Info) ;

    /* --------------------------------------------------------------------- */
    /* free the workspace */
    /* --------------------------------------------------------------------- */

    SuiteSparse_free (Rp) ;
    SuiteSparse_free (Ri) ;
    SuiteSparse_free (Len) ;
    SuiteSparse_free (Pinv) ;
    SuiteSparse_free (S) ;
    if (info) Info [AMD_STATUS] = status ;
    return (status) ;	    /* successful ordering */
}